

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_vtab_cursor *__s;
  sqlite3_uint64 n;
  uint uVar1;
  Fts5FullTable *pTab;
  Fts5Config *pConfig;
  char **ppcVar2;
  Fts5Cursor *pFVar3;
  Fts5Config *pConfig_00;
  char *pcVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  sqlite3_vtab *psVar10;
  uchar *zExpr;
  uchar *puVar11;
  char *pcVar12;
  sqlite3_vtab *ppStmt;
  char **pzErr;
  sqlite3_value *psVar13;
  sqlite3_value *pVal;
  ulong uVar14;
  uint uVar15;
  sqlite3_value *pVal_00;
  uint bDesc;
  sqlite3_vtab *psVar16;
  bool bVar17;
  bool bVar18;
  sqlite3_value *local_58;
  sqlite3_vtab_cursor local_48;
  char *zRank;
  char **local_38;
  
  pTab = (Fts5FullTable *)pCursor->pVtab;
  pConfig = (pTab->p).pConfig;
  ppcVar2 = pConfig->pzErrmsg;
  __s = pCursor + 4;
  if (*(int *)&pCursor[4].pVtab != 0) {
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    memset(__s,0,0x98);
  }
  pzErr = &(pTab->p).base.zErrMsg;
  pConfig->pzErrmsg = pzErr;
  bVar17 = (idxNum & 1U) != 0;
  if (bVar17) {
    bVar18 = *apVal == (sqlite3_value *)0x0;
  }
  else {
    bVar18 = true;
  }
  if ((idxNum & 2U) == 0) {
    local_58 = (sqlite3_value *)0x0;
    uVar14 = (ulong)bVar17;
  }
  else {
    uVar14 = (ulong)(bVar17 + 1);
    local_58 = apVal[bVar17];
  }
  if ((idxNum & 4U) == 0) {
    psVar13 = (sqlite3_value *)0x0;
    uVar9 = uVar14;
  }
  else {
    uVar9 = (ulong)((int)uVar14 + 1);
    psVar13 = apVal[uVar14];
  }
  uVar15 = (uint)uVar9;
  if ((idxNum & 8U) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    uVar15 = uVar15 + 1;
    pVal_00 = apVal[uVar9];
  }
  if ((idxNum & 0x10U) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar15];
  }
  uVar15 = idxNum & 0x80;
  bDesc = uVar15 >> 7;
  *(uint *)((long)&pCursor[4].pVtab + 4) = bDesc;
  if (psVar13 != (sqlite3_value *)0x0) {
    pVal = psVar13;
    pVal_00 = psVar13;
  }
  local_38 = ppcVar2;
  psVar10 = (sqlite3_vtab *)fts5GetRowidLimit(pVal_00,0x7fffffffffffffff);
  pCursor[(ulong)(uVar15 == 0) + 5].pVtab = psVar10;
  psVar10 = (sqlite3_vtab *)fts5GetRowidLimit(pVal,-0x8000000000000000);
  pCursor[(ulong)bDesc + 5].pVtab = psVar10;
  pFVar3 = pTab->pSortCsr;
  if (pFVar3 != (Fts5Cursor *)0x0) {
    bVar17 = pFVar3->bDesc == 0;
    pCursor[6].pVtab = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[bVar17];
    pCursor[5].pVtab = (sqlite3_vtab *)(&pFVar3->iFirstRowid)[!bVar17];
    *(undefined4 *)&pCursor[4].pVtab = 2;
    pCursor[8].pVtab = (sqlite3_vtab *)pFVar3->pExpr;
    iVar7 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,bDesc);
    goto LAB_001b06ce;
  }
  if (bVar18) {
    if (pConfig->zContent != (char *)0x0) {
      *(uint *)&__s->pVtab = (psVar13 != (sqlite3_value *)0x0) + 5;
      if (psVar13 == (sqlite3_value *)0x0) {
        uVar15 = (uint)(*(int *)((long)&pCursor[4].pVtab + 4) != 0);
      }
      else {
        uVar15 = 2;
      }
      iVar7 = sqlite3Fts5StorageStmt(pTab->pStorage,uVar15,(sqlite3_stmt **)(pCursor + 7),pzErr);
      if (iVar7 == 0) {
        psVar10 = pCursor[7].pVtab;
        if (*(int *)&__s->pVtab == 6) {
          sqlite3_bind_value((sqlite3_stmt *)psVar10,1,*apVal);
        }
        else {
          sqlite3_bind_int64((sqlite3_stmt *)psVar10,1,(sqlite_int64)pCursor[5].pVtab);
          sqlite3_bind_int64((sqlite3_stmt *)pCursor[7].pVtab,2,(sqlite_int64)pCursor[6].pVtab);
        }
        iVar7 = fts5NextMethod(pCursor);
      }
      goto LAB_001b06ce;
    }
    pcVar12 = sqlite3_mprintf("%s: table does not support scanning",pConfig->zName);
    pzErr = pConfig->pzErrmsg;
LAB_001b069b:
    *pzErr = pcVar12;
  }
  else {
    zExpr = sqlite3_value_text(*apVal);
    if (zExpr == (uchar *)0x0) {
      zExpr = "";
    }
    if (local_58 == (sqlite3_value *)0x0) {
      if ((sqlite3_vtab *)pConfig->zRank == (sqlite3_vtab *)0x0) {
        pCursor[0xc].pVtab = (sqlite3_vtab *)"bm25";
        pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      }
      else {
        pCursor[0xc].pVtab = (sqlite3_vtab *)pConfig->zRank;
        pCursor[0xd].pVtab = (sqlite3_vtab *)pConfig->zRankArgs;
      }
LAB_001b05db:
      if (*zExpr != '*') {
        iVar7 = sqlite3Fts5ExprNew(pConfig,idxNum >> 0x10,(char *)zExpr,(Fts5Expr **)(pCursor + 8),
                                   pzErr);
        if (iVar7 == 0) {
          if ((idxNum & 0x20U) == 0) {
            *(undefined4 *)&pCursor[4].pVtab = 1;
            iVar7 = fts5CursorFirst(pTab,(Fts5Cursor *)pCursor,bDesc);
          }
          else {
            *(undefined4 *)&pCursor[4].pVtab = 4;
            if (pCursor[8].pVtab == (sqlite3_vtab *)0x0) {
              iVar7 = 0;
            }
            else {
              iVar7 = *(int *)((long)&pCursor[8].pVtab[1].pModule + 4);
            }
            pConfig_00 = (pTab->p).pConfig;
            psVar10 = pCursor[0xc].pVtab;
            psVar16 = pCursor[0xd].pVtab;
            n = (long)iVar7 * 4 + 0x1c;
            ppStmt = (sqlite3_vtab *)sqlite3_malloc64(n);
            if (ppStmt == (sqlite3_vtab *)0x0) {
              iVar7 = 7;
            }
            else {
              memset(ppStmt,0,n);
              pcVar12 = ", ";
              if (psVar16 == (sqlite3_vtab *)0x0) {
                pcVar12 = "";
                psVar16 = (sqlite3_vtab *)0x1c6096;
              }
              *(int *)&ppStmt[1].pModule = iVar7;
              pcVar4 = "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC";
              if (uVar15 == 0) {
                pcVar4 = "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC";
              }
              iVar8 = fts5PrepareStatement
                                ((sqlite3_stmt **)ppStmt,pConfig_00,pcVar12,pConfig_00->zDb,
                                 pConfig_00->zName,psVar10,pConfig_00->zName,pcVar12,psVar16,
                                 pcVar4 + 0x40);
              pCursor[9].pVtab = ppStmt;
              if (iVar8 == 0) {
                pTab->pSortCsr = (Fts5Cursor *)pCursor;
                iVar8 = fts5SorterNext((Fts5Cursor *)pCursor);
                pTab->pSortCsr = (Fts5Cursor *)0x0;
                iVar7 = 0;
                if (iVar8 == 0) goto LAB_001b06ce;
              }
              sqlite3_finalize((sqlite3_stmt *)ppStmt->pModule);
              sqlite3_free(ppStmt);
              pCursor[9].pVtab = (sqlite3_vtab *)0x0;
              iVar7 = iVar8;
            }
          }
        }
        goto LAB_001b06ce;
      }
      do {
        puVar11 = zExpr;
        bVar6 = puVar11[1];
        zExpr = puVar11 + 1;
      } while (bVar6 == 0x20);
      uVar14 = 0;
      while ((bVar6 & 0xdf) != 0) {
        lVar5 = uVar14 + 2;
        uVar14 = uVar14 + 1;
        bVar6 = puVar11[lVar5];
      }
      *(undefined4 *)&__s->pVtab = 3;
      iVar7 = sqlite3_strnicmp("reads",(char *)zExpr,(int)uVar14);
      if (iVar7 == 0) {
        psVar10 = (sqlite3_vtab *)(long)((pTab->p).pIndex)->nRead;
      }
      else {
        iVar7 = sqlite3_strnicmp("id",(char *)zExpr,(int)uVar14);
        if (iVar7 != 0) {
          pcVar12 = sqlite3_mprintf("unknown special query: %.*s",uVar14 & 0xffffffff,zExpr);
          goto LAB_001b069b;
        }
        psVar10 = pCursor[3].pVtab;
      }
      pCursor[0xb].pVtab = psVar10;
      iVar7 = 0;
      goto LAB_001b06ce;
    }
    puVar11 = sqlite3_value_text(local_58);
    zRank = (char *)0x0;
    local_48.pVtab = (sqlite3_vtab *)0x0;
    if (puVar11 == (uchar *)0x0) {
      uVar1._0_2_ = local_58->flags;
      uVar1._2_1_ = local_58->enc;
      uVar1._3_1_ = local_58->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_001b0591;
    }
    else {
      iVar7 = sqlite3Fts5ConfigParseRank((char *)puVar11,&zRank,(char **)&local_48);
      if (iVar7 != 1) {
        if (iVar7 != 0) goto LAB_001b06ce;
LAB_001b0591:
        pCursor[0xc].pVtab = (sqlite3_vtab *)zRank;
        pCursor[0xd].pVtab = local_48.pVtab;
        *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 0x10;
        goto LAB_001b05db;
      }
    }
    pcVar12 = sqlite3_mprintf("parse error in rank function: %s",puVar11);
    pCursor->pVtab->zErrMsg = pcVar12;
  }
  iVar7 = 1;
LAB_001b06ce:
  pConfig->pzErrmsg = local_38;
  return iVar7;
}

Assistant:

static int fts5FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;             /* Error code */
  int iVal = 0;                   /* Counter for apVal[] */
  int bDesc;                      /* True if ORDER BY [rank|rowid] DESC */
  int bOrderByRank;               /* True if ORDER BY rank */
  sqlite3_value *pMatch = 0;      /* <tbl> MATCH ? expression (or NULL) */
  sqlite3_value *pRank = 0;       /* rank MATCH ? expression (or NULL) */
  sqlite3_value *pRowidEq = 0;    /* rowid = ? expression (or NULL) */
  sqlite3_value *pRowidLe = 0;    /* rowid <= ? expression (or NULL) */
  sqlite3_value *pRowidGe = 0;    /* rowid >= ? expression (or NULL) */
  int iCol;                       /* Column on LHS of MATCH operator */
  char **pzErrmsg = pConfig->pzErrmsg;

  UNUSED_PARAM(zUnused);
  UNUSED_PARAM(nVal);

  if( pCsr->ePlan ){
    fts5FreeCursorComponents(pCsr);
    memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan-(u8*)pCsr));
  }

  assert( pCsr->pStmt==0 );
  assert( pCsr->pExpr==0 );
  assert( pCsr->csrflags==0 );
  assert( pCsr->pRank==0 );
  assert( pCsr->zRank==0 );
  assert( pCsr->zRankArgs==0 );

  assert( pzErrmsg==0 || pzErrmsg==&pTab->p.base.zErrMsg );
  pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Decode the arguments passed through to this function.
  **
  ** Note: The following set of if(...) statements must be in the same
  ** order as the corresponding entries in the struct at the top of
  ** fts5BestIndexMethod().  */
  if( BitFlagTest(idxNum, FTS5_BI_MATCH) ) pMatch = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_RANK) ) pRank = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_EQ) ) pRowidEq = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_LE) ) pRowidLe = apVal[iVal++];
  if( BitFlagTest(idxNum, FTS5_BI_ROWID_GE) ) pRowidGe = apVal[iVal++];
  iCol = (idxNum>>16);
  assert( iCol>=0 && iCol<=pConfig->nCol );
  assert( iVal==nVal );
  bOrderByRank = ((idxNum & FTS5_BI_ORDER_RANK) ? 1 : 0);
  pCsr->bDesc = bDesc = ((idxNum & FTS5_BI_ORDER_DESC) ? 1 : 0);

  /* Set the cursor upper and lower rowid limits. Only some strategies 
  ** actually use them. This is ok, as the xBestIndex() method leaves the
  ** sqlite3_index_constraint.omit flag clear for range constraints
  ** on the rowid field.  */
  if( pRowidEq ){
    pRowidLe = pRowidGe = pRowidEq;
  }
  if( bDesc ){
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }else{
    pCsr->iLastRowid = fts5GetRowidLimit(pRowidLe, LARGEST_INT64);
    pCsr->iFirstRowid = fts5GetRowidLimit(pRowidGe, SMALLEST_INT64);
  }

  if( pTab->pSortCsr ){
    /* If pSortCsr is non-NULL, then this call is being made as part of 
    ** processing for a "... MATCH <expr> ORDER BY rank" query (ePlan is
    ** set to FTS5_PLAN_SORTED_MATCH). pSortCsr is the cursor that will
    ** return results to the user for this query. The current cursor 
    ** (pCursor) is used to execute the query issued by function 
    ** fts5CursorFirstSorted() above.  */
    assert( pRowidEq==0 && pRowidLe==0 && pRowidGe==0 && pRank==0 );
    assert( nVal==0 && pMatch==0 && bOrderByRank==0 && bDesc==0 );
    assert( pCsr->iLastRowid==LARGEST_INT64 );
    assert( pCsr->iFirstRowid==SMALLEST_INT64 );
    if( pTab->pSortCsr->bDesc ){
      pCsr->iLastRowid = pTab->pSortCsr->iFirstRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iLastRowid;
    }else{
      pCsr->iLastRowid = pTab->pSortCsr->iLastRowid;
      pCsr->iFirstRowid = pTab->pSortCsr->iFirstRowid;
    }
    pCsr->ePlan = FTS5_PLAN_SOURCE;
    pCsr->pExpr = pTab->pSortCsr->pExpr;
    rc = fts5CursorFirst(pTab, pCsr, bDesc);
  }else if( pMatch ){
    const char *zExpr = (const char*)sqlite3_value_text(apVal[0]);
    if( zExpr==0 ) zExpr = "";

    rc = fts5CursorParseRank(pConfig, pCsr, pRank);
    if( rc==SQLITE_OK ){
      if( zExpr[0]=='*' ){
        /* The user has issued a query of the form "MATCH '*...'". This
        ** indicates that the MATCH expression is not a full text query,
        ** but a request for an internal parameter.  */
        rc = fts5SpecialMatch(pTab, pCsr, &zExpr[1]);
      }else{
        char **pzErr = &pTab->p.base.zErrMsg;
        rc = sqlite3Fts5ExprNew(pConfig, iCol, zExpr, &pCsr->pExpr, pzErr);
        if( rc==SQLITE_OK ){
          if( bOrderByRank ){
            pCsr->ePlan = FTS5_PLAN_SORTED_MATCH;
            rc = fts5CursorFirstSorted(pTab, pCsr, bDesc);
          }else{
            pCsr->ePlan = FTS5_PLAN_MATCH;
            rc = fts5CursorFirst(pTab, pCsr, bDesc);
          }
        }
      }
    }
  }else if( pConfig->zContent==0 ){
    *pConfig->pzErrmsg = sqlite3_mprintf(
        "%s: table does not support scanning", pConfig->zName
    );
    rc = SQLITE_ERROR;
  }else{
    /* This is either a full-table scan (ePlan==FTS5_PLAN_SCAN) or a lookup
    ** by rowid (ePlan==FTS5_PLAN_ROWID).  */
    pCsr->ePlan = (pRowidEq ? FTS5_PLAN_ROWID : FTS5_PLAN_SCAN);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, fts5StmtType(pCsr), &pCsr->pStmt, &pTab->p.base.zErrMsg
    );
    if( rc==SQLITE_OK ){
      if( pCsr->ePlan==FTS5_PLAN_ROWID ){
        sqlite3_bind_value(pCsr->pStmt, 1, apVal[0]);
      }else{
        sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iFirstRowid);
        sqlite3_bind_int64(pCsr->pStmt, 2, pCsr->iLastRowid);
      }
      rc = fts5NextMethod(pCursor);
    }
  }

  pConfig->pzErrmsg = pzErrmsg;
  return rc;
}